

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall CVmObjTads::build_prop_list(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval)

{
  ushort uVar1;
  vm_obj_id_t obj;
  vm_tadsobj_hdr *pvVar2;
  vm_val_t *in_RDX;
  CVmObjTads *in_RDI;
  vm_val_t val;
  vm_tadsobj_hdr *hdr;
  vm_tadsobj_prop *entry;
  CVmObjList *lst;
  size_t idx;
  size_t cnt;
  vm_datatype_t in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  vm_tadsobj_prop *local_38;
  ulong local_20;
  
  pvVar2 = get_hdr(in_RDI);
  uVar1 = pvVar2->prop_entry_free;
  obj = CVmObjList::create(in_stack_ffffffffffffffb4,(size_t)in_RDX);
  vm_val_t::set_obj(in_RDX,obj);
  vm_objp(0);
  local_38 = pvVar2->prop_entry_arr;
  for (local_20 = (ulong)uVar1; local_20 != 0; local_20 = local_20 - 1) {
    vm_val_t::set_propid((vm_val_t *)&stack0xffffffffffffffb0,local_38->prop);
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (size_t)in_RDX,(vm_val_t *)0x346862);
    local_38 = local_38 + 1;
  }
  CVmObjList::cons_set_len
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (size_t)in_RDX);
  return;
}

Assistant:

void CVmObjTads::build_prop_list(VMG_ vm_obj_id_t self, vm_val_t *retval)
{
    size_t cnt;
    size_t idx;
    CVmObjList *lst;
    vm_tadsobj_prop *entry;
    vm_tadsobj_hdr *hdr = get_hdr();
    
    /* the next free index is also the number of properties we have */
    cnt = hdr->prop_entry_free;

    /* allocate a list big enough for all of our properties */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));

    /* get the list object, property cast */
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* add our image file properties to the list */
    for (idx = 0, entry = hdr->prop_entry_arr ; cnt != 0 ;
         --cnt, ++entry)
    {
        /* make a value for this property ID */
        vm_val_t val;
        val.set_propid(entry->prop);

        /* add it to the list */
        lst->cons_set_element(idx++, &val);
    }

    /* set the final length of the list */
    lst->cons_set_len(idx);
}